

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O2

bool __thiscall
duckdb::Pipeline::ScheduleParallel(Pipeline *this,shared_ptr<duckdb::Event,_true> *event)

{
  optional_ptr<duckdb::PhysicalOperator,_true> *this_00;
  pointer prVar1;
  bool bVar2;
  int iVar3;
  PhysicalOperator *pPVar4;
  pointer pGVar5;
  undefined4 extraout_var;
  TaskScheduler *pTVar6;
  unsigned_long max_threads;
  pointer pGVar7;
  ulong uVar8;
  InternalException *this_01;
  reference_wrapper<duckdb::PhysicalOperator> *op_ref;
  pointer prVar9;
  allocator local_71;
  undefined1 local_70 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_60;
  OperatorPartitionInfo partition_info;
  undefined4 extraout_var_00;
  
  this_00 = &this->sink;
  pPVar4 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->(this_00);
  iVar3 = (*pPVar4->_vptr_PhysicalOperator[0x22])(pPVar4);
  if ((char)iVar3 != '\0') {
    pPVar4 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->(&this->source);
    iVar3 = (*pPVar4->_vptr_PhysicalOperator[0x14])(pPVar4);
    if ((char)iVar3 != '\0') {
      prVar9 = (this->operators).
               super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      prVar1 = (this->operators).
               super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      do {
        if (prVar9 == prVar1) {
          pPVar4 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->(this_00);
          (*pPVar4->_vptr_PhysicalOperator[0x23])(&partition_info,pPVar4);
          if (partition_info.batch_index == true) {
            pPVar4 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->(&this->source);
            local_70[0] = (string)0x1;
            local_70._8_8_ = 0;
            aStack_60._M_allocated_capacity = 0;
            aStack_60._8_8_ = 0;
            iVar3 = (*pPVar4->_vptr_PhysicalOperator[0x15])(pPVar4,local_70);
            ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                      ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)(local_70 + 8)
                      );
            if ((char)iVar3 == '\0') {
              this_01 = (InternalException *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)local_70,
                         "Attempting to schedule a pipeline where the sink requires batch index but source does not support it"
                         ,&local_71);
              InternalException::InternalException(this_01,(string *)local_70);
              __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error)
              ;
            }
          }
          pGVar5 = unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
                   ::operator->(&this->source_state);
          iVar3 = (*pGVar5->_vptr_GlobalSourceState[2])(pGVar5);
          pTVar6 = TaskScheduler::GetScheduler(this->executor->context);
          max_threads = NumericCastImpl<unsigned_long,_int,_false>::Convert
                                  ((pTVar6->current_thread_count).super___atomic_base<int>._M_i);
          uVar8 = CONCAT44(extraout_var,iVar3);
          if (max_threads <= CONCAT44(extraout_var,iVar3)) {
            uVar8 = max_threads;
          }
          if ((this_00->ptr != (PhysicalOperator *)0x0) &&
             (pPVar4 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->(this_00),
             (pPVar4->sink_state).
             super_unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::GlobalSinkState_*,_std::default_delete<duckdb::GlobalSinkState>_>
             .super__Head_base<0UL,_duckdb::GlobalSinkState_*,_false>._M_head_impl !=
             (GlobalSinkState *)0x0)) {
            pPVar4 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->(this_00);
            pGVar7 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                     ::operator->(&pPVar4->sink_state);
            iVar3 = (*pGVar7->_vptr_GlobalSinkState[2])(pGVar7,uVar8);
            uVar8 = CONCAT44(extraout_var_00,iVar3);
          }
          if (uVar8 < max_threads) {
            max_threads = uVar8;
          }
          bVar2 = LaunchScanTasks(this,event,max_threads);
          ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                     &partition_info.partition_columns);
          return bVar2;
        }
        iVar3 = (*prVar9->_M_data->_vptr_PhysicalOperator[0xc])();
        prVar9 = prVar9 + 1;
      } while ((char)iVar3 != '\0');
    }
  }
  return false;
}

Assistant:

bool Pipeline::ScheduleParallel(shared_ptr<Event> &event) {
	// check if the sink, source and all intermediate operators support parallelism
	if (!sink->ParallelSink()) {
		return false;
	}
	if (!source->ParallelSource()) {
		return false;
	}
	for (auto &op_ref : operators) {
		auto &op = op_ref.get();
		if (!op.ParallelOperator()) {
			return false;
		}
	}
	auto partition_info = sink->RequiredPartitionInfo();
	if (partition_info.batch_index) {
		if (!source->SupportsPartitioning(OperatorPartitionInfo::BatchIndex())) {
			throw InternalException(
			    "Attempting to schedule a pipeline where the sink requires batch index but source does not support it");
		}
	}
	auto max_threads = source_state->MaxThreads();
	auto &scheduler = TaskScheduler::GetScheduler(executor.context);
	auto active_threads = NumericCast<idx_t>(scheduler.NumberOfThreads());
	if (max_threads > active_threads) {
		max_threads = active_threads;
	}
	if (sink && sink->sink_state) {
		max_threads = sink->sink_state->MaxThreads(max_threads);
	}
	if (max_threads > active_threads) {
		max_threads = active_threads;
	}
	return LaunchScanTasks(event, max_threads);
}